

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O0

void soul::CallFlowGraph::iterateCallSequences
               (Function *f,CallSequenceCheckResults *results,PreviousCall *previous,
               uint64_t stackSize)

{
  bool bVar1;
  unsigned_long *puVar2;
  reference this;
  Block *pBVar3;
  Iterator other;
  FunctionCall *this_00;
  Function *f_00;
  pool_ptr<soul::heart::FunctionCall> local_88;
  pool_ptr<soul::heart::FunctionCall> call;
  Statement *s;
  Iterator __end3;
  Iterator __begin3;
  LinkedList<soul::heart::Statement> *__range3;
  pool_ref<soul::heart::Block> *b;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *__range2;
  PreviousCall newPrevious;
  uint64_t stackSize_local;
  PreviousCall *previous_local;
  CallSequenceCheckResults *results_local;
  Function *f_local;
  
  newPrevious.function = (Function *)stackSize;
  calculateLocalVariableStackSize(f);
  newPrevious.function =
       (Function *)
       ((long)((newPrevious.function)->parameters).space + (f->localVariableStackSize - 0x40));
  puVar2 = std::max<unsigned_long>
                     (&results->maximumStackSize,(unsigned_long *)&newPrevious.function);
  results->maximumStackSize = *puVar2;
  __range2 = (vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
              *)previous;
  newPrevious.previous = (PreviousCall *)f;
  if ((previous == (PreviousCall *)0x0) || (bVar1 = PreviousCall::contains(previous,f), !bVar1)) {
    __end2 = std::
             vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
             ::begin(&f->blocks);
    b = (pool_ref<soul::heart::Block> *)
        std::
        vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ::end(&f->blocks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                                       *)&b), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
             ::operator*(&__end2);
      pBVar3 = pool_ref<soul::heart::Block>::operator->(this);
      __end3 = LinkedList<soul::heart::Statement>::begin(&pBVar3->statements);
      other = LinkedList<soul::heart::Statement>::end();
      while (bVar1 = LinkedList<soul::heart::Statement>::Iterator::operator!=(&__end3,other), bVar1)
      {
        call.object = (FunctionCall *)
                      LinkedList<soul::heart::Statement>::Iterator::operator*(&__end3);
        cast<soul::heart::FunctionCall,soul::heart::Statement>
                  ((soul *)&local_88,(Statement *)call.object);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_88);
        if (bVar1) {
          this_00 = pool_ptr<soul::heart::FunctionCall>::operator->(&local_88);
          f_00 = heart::FunctionCall::getFunction(this_00);
          iterateCallSequences
                    (f_00,results,(PreviousCall *)&__range2,(uint64_t)newPrevious.function);
        }
        pool_ptr<soul::heart::FunctionCall>::~pool_ptr(&local_88);
        LinkedList<soul::heart::Statement>::Iterator::operator++(&__end3);
      }
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    bVar1 = std::
            vector<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
            ::empty(&results->recursiveFunctionCallSequence);
    if (bVar1) {
      PreviousCall::findCallSequenceUpTo(previous,f,&results->recursiveFunctionCallSequence);
    }
  }
  return;
}

Assistant:

static void iterateCallSequences (heart::Function& f,
                                      CallSequenceCheckResults& results,
                                      PreviousCall* previous,
                                      uint64_t stackSize)
    {
        calculateLocalVariableStackSize (f);
        stackSize += perCallStackOverhead + f.localVariableStackSize;
        results.maximumStackSize = std::max (results.maximumStackSize, stackSize);

        PreviousCall newPrevious { previous, f };

        if (previous != nullptr && previous->contains (f))
        {
            if (results.recursiveFunctionCallSequence.empty())
                previous->findCallSequenceUpTo (f, results.recursiveFunctionCallSequence);

            return;
        }

        for (auto& b : f.blocks)
            for (auto s : b->statements)
                if (auto call = cast<heart::FunctionCall> (*s))
                    iterateCallSequences (call->getFunction(), results, std::addressof (newPrevious), stackSize);
    }